

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_mem clCreateFromGLRenderbuffer
                 (cl_context context,cl_mem_flags flags,cl_GLuint renderbuffer,cl_int *errcode_ret)

{
  uint64_t enqueueCounter_00;
  CLIntercept *this;
  cl_context p_Var1;
  bool bVar2;
  cl_icd_dispatch *pcVar3;
  SConfig *pSVar4;
  undefined8 uVar5;
  time_point end;
  uint *in_RCX;
  cl_GLuint in_EDX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  cl_context in_RDI;
  CLIntercept *unaff_retaddr;
  cl_int in_stack_000000c4;
  char *in_stack_000000c8;
  cl_mem retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffeb0;
  CLIntercept *in_stack_fffffffffffffeb8;
  _cl_mem *in_stack_fffffffffffffec0;
  allocator *paVar6;
  CLIntercept *in_stack_fffffffffffffec8;
  int local_104;
  CLIntercept *local_100;
  uint64_t local_f8;
  cl_mem_flags in_stack_ffffffffffffff10;
  CEnumNameMap *in_stack_ffffffffffffff18;
  uint64_t in_stack_ffffffffffffff40;
  allocator in_stack_ffffffffffffff4f;
  string *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CLIntercept *in_stack_ffffffffffffff60;
  time_point in_stack_ffffffffffffff68;
  time_point in_stack_ffffffffffffff70;
  time_point in_stack_ffffffffffffff80;
  CLIntercept *local_78;
  uint64_t local_70;
  uint local_68 [4];
  string local_58 [32];
  uint64_t local_38;
  CLIntercept *local_30;
  uint *local_28;
  cl_GLuint local_1c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_18;
  cl_context local_10;
  cl_mem in_stack_fffffffffffffff8;
  
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = GetIntercept();
  if ((local_30 == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(local_30),
     pcVar3->clCreateFromGLRenderbuffer == (cl_api_clCreateFromGLRenderbuffer)0x0)) {
    local_104 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_104);
    if (local_28 != (uint *)0x0) {
      *local_28 = 0xffffffde;
    }
    end.__d.__r = (duration)0;
  }
  else {
    local_38 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffeb8);
    pSVar4 = CLIntercept::config(local_30);
    p_Var1 = local_10;
    this = local_30;
    enqueueCounter_00 = local_38;
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::enumName(local_30);
      CEnumNameMap::name_mem_flags_abi_cxx11_(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      uVar5 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffeb0 = local_18;
      CLIntercept::callLoggingEnter
                (this,"clCreateFromGLRenderbuffer",enqueueCounter_00,(cl_kernel)0x0,
                 "context = %p, flags = %s (%llX)",p_Var1,uVar5);
      std::__cxx11::string::~string(local_58);
    }
    local_68[0] = 0;
    pSVar4 = CLIntercept::config(local_30);
    if ((((((pSVar4->CallLogging & 1U) != 0) ||
          (pSVar4 = CLIntercept::config(local_30), (pSVar4->ErrorLogging & 1U) != 0)) ||
         (pSVar4 = CLIntercept::config(local_30), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_30), (pSVar4->NoErrors & 1U) != 0)) &&
       (local_28 == (uint *)0x0)) {
      local_28 = local_68;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    pSVar4 = CLIntercept::config(local_30);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_30), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffff80.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_70 = (uint64_t)in_stack_ffffffffffffff80.__d.__r;
    }
    pcVar3 = CLIntercept::dispatch(local_30);
    end.__d.__r = (duration)
                  (*pcVar3->clCreateFromGLRenderbuffer)
                            (local_10,(cl_mem_flags)local_18,local_1c,(cl_int *)local_28);
    pSVar4 = CLIntercept::config(local_30);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_30), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      local_78 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffff70.__d.__r = (duration)(duration)local_78;
      pSVar4 = CLIntercept::config(local_30);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_30,local_38), bVar2)) {
        in_stack_fffffffffffffec8 = local_30;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff50,"",(allocator *)&stack0xffffffffffffff4f);
        in_stack_ffffffffffffff40 = local_70;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff70.__d.__r,
                   (char *)in_stack_ffffffffffffff68.__d.__r,(string *)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff80,end);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
      }
    }
    if ((end.__d.__r != 0) &&
       (((pSVar4 = CLIntercept::config(local_30), (pSVar4->DumpImagesBeforeEnqueue & 1U) != 0 ||
         (pSVar4 = CLIntercept::config(local_30), (pSVar4->DumpImagesAfterEnqueue & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_30), (pSVar4->CaptureReplay & 1U) != 0)))) {
      CLIntercept::addImage(unaff_retaddr,in_stack_fffffffffffffff8);
    }
    pSVar4 = CLIntercept::config(local_30);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(local_30), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_30), (pSVar4->NoErrors & 1U) != 0)) && (*local_28 != 0))
    {
      pSVar4 = CLIntercept::config(local_30);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError((CLIntercept *)retVal,in_stack_000000c8,in_stack_000000c4);
      }
      pSVar4 = CLIntercept::config(local_30);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config(local_30);
      if ((pSVar4->NoErrors & 1U) != 0) {
        *local_28 = 0;
      }
    }
    pSVar4 = CLIntercept::config(local_30);
    if ((pSVar4->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(local_30);
      CObjectTracker::AddAllocation<_cl_mem*>
                ((CObjectTracker *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    pSVar4 = CLIntercept::config(local_30);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (local_30,"clCreateFromGLRenderbuffer",(cl_int)(ulong)*local_28,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",end.__d.__r);
    }
    pSVar4 = CLIntercept::config(local_30);
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      paVar6 = (allocator *)&stack0xffffffffffffff17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff18,"",paVar6);
      local_f8 = local_70;
      local_100 = local_78;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff40,in_stack_ffffffffffffff70
                 ,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
    }
  }
  return (cl_mem)end.__d.__r;
}

Assistant:

CL_API_ENTRY cl_mem CL_API_CALL CLIRN(clCreateFromGLRenderbuffer)(
    cl_context context,
    cl_mem_flags flags,
    cl_GLuint renderbuffer,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clCreateFromGLRenderbuffer )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER(
            "context = %p, "
            "flags = %s (%llX)",
            context,
            pIntercept->enumName().name_mem_flags( flags ).c_str(),
            flags );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_mem  retVal = pIntercept->dispatch().clCreateFromGLRenderbuffer(
            context,
            flags,
            renderbuffer,
            errcode_ret);

        HOST_PERFORMANCE_TIMING_END();
        ADD_IMAGE( retVal );
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}